

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool dxil_spv::Converter::Impl::scan_samplers
               (ResourceRemappingInterface *iface,MDNode *samplers,ShaderStage stage)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  MDOperand *md;
  MDNode *node;
  uint i;
  uint index;
  D3DBinding d3d_binding;
  VulkanBinding vulkan_binding;
  
  uVar1 = LLVMBC::MDNode::getNumOperands(samplers);
  for (index = 0; uVar1 != index; index = index + 1) {
    md = LLVMBC::MDNode::getOperand(samplers,index);
    node = LLVMBC::cast<LLVMBC::MDNode>(md);
    uVar2 = get_constant_metadata<unsigned_int>(node,0);
    uVar3 = get_constant_metadata<unsigned_int>(node,3);
    uVar4 = get_constant_metadata<unsigned_int>(node,4);
    d3d_binding.range_size = get_constant_metadata<unsigned_int>(node,5);
    d3d_binding.kind = Sampler;
    d3d_binding.alignment = 0;
    vulkan_binding.bindless.use_heap = false;
    vulkan_binding.bindless._5_3_ = 0;
    vulkan_binding.descriptor_type = Identity;
    vulkan_binding.descriptor_set = 0;
    vulkan_binding.binding = 0;
    vulkan_binding.root_constant_index = 0;
    vulkan_binding.bindless.heap_root_offset = 0;
    d3d_binding.stage = stage;
    d3d_binding.resource_index = uVar2;
    d3d_binding.register_space = uVar3;
    d3d_binding.register_index = uVar4;
    if (iface != (ResourceRemappingInterface *)0x0) {
      iVar5 = (*iface->_vptr_ResourceRemappingInterface[3])(iface,&d3d_binding,&vulkan_binding);
      if ((char)iVar5 == '\0') break;
    }
  }
  return uVar1 <= index;
}

Assistant:

bool Converter::Impl::scan_samplers(ResourceRemappingInterface *iface, const llvm::MDNode *samplers, ShaderStage stage)
{
	unsigned num_samplers = samplers->getNumOperands();
	for (unsigned i = 0; i < num_samplers; i++)
	{
		auto *sampler = llvm::cast<llvm::MDNode>(samplers->getOperand(i));
		unsigned index = get_constant_metadata(sampler, 0);
		unsigned bind_space = get_constant_metadata(sampler, 3);
		unsigned bind_register = get_constant_metadata(sampler, 4);
		unsigned range_size = get_constant_metadata(sampler, 5);

		D3DBinding d3d_binding = { stage, DXIL::ResourceKind::Sampler, index, bind_space, bind_register, range_size };
		VulkanBinding vulkan_binding = {};
		if (iface && !iface->remap_sampler(d3d_binding, vulkan_binding))
			return false;
	}

	return true;
}